

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringReplaceHelper.cxx
# Opt level: O2

void __thiscall
cmStringReplaceHelper::cmStringReplaceHelper
          (cmStringReplaceHelper *this,string *regex,string *replace_expr,cmMakefile *makefile)

{
  (this->ErrorString)._M_dataplus._M_p = (pointer)&(this->ErrorString).field_2;
  (this->ErrorString)._M_string_length = 0;
  (this->ErrorString).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->RegExString,(string *)regex);
  cmsys::RegularExpression::RegularExpression(&this->RegularExpression,regex);
  this->ValidReplaceExpression = true;
  std::__cxx11::string::string((string *)&this->ReplaceExpression,(string *)replace_expr);
  (this->Replacements).
  super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Replacements).
  super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Replacements).
  super__Vector_base<cmStringReplaceHelper::RegexReplacement,_std::allocator<cmStringReplaceHelper::RegexReplacement>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->Makefile = makefile;
  ParseReplaceExpression(this);
  return;
}

Assistant:

cmStringReplaceHelper::cmStringReplaceHelper(const std::string& regex,
                                             std::string replace_expr,
                                             cmMakefile* makefile)
  : RegExString(regex)
  , RegularExpression(regex)
  , ReplaceExpression(std::move(replace_expr))
  , Makefile(makefile)
{
  this->ParseReplaceExpression();
}